

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onepass.cc
# Opt level: O3

bool __thiscall re2::Prog::IsOnePass(Prog *this)

{
  Inst *this_00;
  size_t __n;
  byte bVar1;
  Inst *pIVar2;
  uchar *p;
  undefined1 auVar3 [16];
  bool bVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  _Tuple_impl<1UL,_re2::PODArray<unsigned_char>::Deleter> _Var9;
  InstCond *p_00;
  int *__s;
  long lVar10;
  ulong uVar11;
  uchar *__dest;
  uint uVar12;
  _Head_base<0UL,_int_*,_false> _Var13;
  long lVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  uint id;
  uint *puVar18;
  uint uVar19;
  int iVar20;
  size_type __n_00;
  bool bVar21;
  vector<unsigned_char,_std::allocator<unsigned_char>_> nodes;
  Instq workq;
  Instq tovisit;
  uint local_270;
  size_type local_260;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_248;
  ulong local_230;
  size_type local_228;
  int local_21c;
  int *local_218;
  long local_210;
  long local_208;
  SparseSetT<void> local_200;
  SparseSetT<void> local_1d8;
  LogMessage local_1b0;
  
  if (this->did_onepass_ == true) {
    bVar21 = (this->onepass_nodes_).ptr_._M_t.
             super___uniq_ptr_impl<unsigned_char,_re2::PODArray<unsigned_char>::Deleter>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_re2::PODArray<unsigned_char>::Deleter>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl != (uchar *)0x0;
  }
  else {
    this->did_onepass_ = true;
    if ((this->start_ != 0) && ((long)this->inst_count_[2] < 0xfde6)) {
      local_208 = (long)this->inst_count_[2] + 2;
      lVar14 = this->dfa_mem_;
      lVar10 = lVar14 + 3;
      if (-1 < lVar14) {
        lVar10 = lVar14;
      }
      iVar8 = this->bytemap_range_ * 4 + 4;
      local_228 = (size_type)iVar8;
      auVar3._8_8_ = lVar10 >> 0x3f;
      auVar3._0_8_ = lVar10 >> 2;
      if (local_208 <= SUB168(auVar3 / SEXT816((long)local_228),0)) {
        __n_00 = (size_type)(this->inst_count_[3] + this->inst_count_[4] + this->inst_count_[6] + 1)
        ;
        p_00 = __gnu_cxx::new_allocator<re2::InstCond>::allocate
                         ((new_allocator<re2::InstCond> *)&local_1b0,__n_00,(void *)0x0);
        iVar6 = this->size_;
        __s = __gnu_cxx::new_allocator<int>::allocate
                        ((new_allocator<int> *)&local_1b0,(long)iVar6,(void *)0x0);
        __n = (long)iVar6 * 4;
        memset(__s,0xff,__n);
        local_248.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_248.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (uchar *)0x0;
        local_248.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        SparseSetT<void>::SparseSetT(&local_1d8,iVar6);
        SparseSetT<void>::SparseSetT(&local_200,iVar6);
        AddQ(&local_1d8,this->start_);
        __s[this->start_] = 0;
        local_1b0.flushed_ = false;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_insert
                  (&local_248,
                   (iterator)
                   local_248.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish,local_228,&local_1b0.flushed_);
        if (local_1d8.size_ == 0) {
          iVar6 = 1;
LAB_00231f1e:
          _Var9.super__Head_base<1UL,_re2::PODArray<unsigned_char>::Deleter,_false>._M_head_impl.
          len_ = (_Head_base<1UL,_re2::PODArray<unsigned_char>::Deleter,_false>)(iVar6 * iVar8);
          this->dfa_mem_ =
               this->dfa_mem_ -
               (long)(int)_Var9.super__Head_base<1UL,_re2::PODArray<unsigned_char>::Deleter,_false>.
                          _M_head_impl.len_;
          if ((int)_Var9.super__Head_base<1UL,_re2::PODArray<unsigned_char>::Deleter,_false>.
                   _M_head_impl.len_ < 0) {
            std::__throw_bad_alloc();
          }
          __dest = (uchar *)operator_new((ulong)(uint)_Var9.
                                                  super__Head_base<1UL,_re2::PODArray<unsigned_char>::Deleter,_false>
                                                  ._M_head_impl.len_);
          p = (this->onepass_nodes_).ptr_._M_t.
              super___uniq_ptr_impl<unsigned_char,_re2::PODArray<unsigned_char>::Deleter>._M_t.
              super__Tuple_impl<0UL,_unsigned_char_*,_re2::PODArray<unsigned_char>::Deleter>.
              super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
          (this->onepass_nodes_).ptr_._M_t.
          super___uniq_ptr_impl<unsigned_char,_re2::PODArray<unsigned_char>::Deleter>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_re2::PODArray<unsigned_char>::Deleter>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = __dest;
          if (p != (uchar *)0x0) {
            operator_delete(p,(long)(int)(this->onepass_nodes_).ptr_._M_t.
                                         super___uniq_ptr_impl<unsigned_char,_re2::PODArray<unsigned_char>::Deleter>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_unsigned_char_*,_re2::PODArray<unsigned_char>::Deleter>
                                         .
                                         super__Tuple_impl<1UL,_re2::PODArray<unsigned_char>::Deleter>
                                         .
                                         super__Head_base<1UL,_re2::PODArray<unsigned_char>::Deleter,_false>
                           );
            __dest = (this->onepass_nodes_).ptr_._M_t.
                     super___uniq_ptr_impl<unsigned_char,_re2::PODArray<unsigned_char>::Deleter>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_char_*,_re2::PODArray<unsigned_char>::Deleter>.
                     super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
          }
          (this->onepass_nodes_).ptr_._M_t.
          super___uniq_ptr_impl<unsigned_char,_re2::PODArray<unsigned_char>::Deleter>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_re2::PODArray<unsigned_char>::Deleter>.
          super__Tuple_impl<1UL,_re2::PODArray<unsigned_char>::Deleter>.
          super__Head_base<1UL,_re2::PODArray<unsigned_char>::Deleter,_false> =
               _Var9.super__Head_base<1UL,_re2::PODArray<unsigned_char>::Deleter,_false>.
               _M_head_impl.len_;
          memmove(__dest,local_248.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                  (long)(int)_Var9.
                             super__Head_base<1UL,_re2::PODArray<unsigned_char>::Deleter,_false>.
                             _M_head_impl.len_);
          bVar21 = true;
LAB_00231f8f:
          SparseSetT<void>::~SparseSetT(&local_200);
          SparseSetT<void>::~SparseSetT(&local_1d8);
          if (local_248.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_248.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_248.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_248.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (__s != (int *)0x0) {
            operator_delete(__s,__n);
          }
          if (p_00 == (InstCond *)0x0) {
            return bVar21;
          }
          operator_delete(p_00,__n_00 << 3);
          return bVar21;
        }
        iVar6 = 1;
        _Var13._M_head_impl =
             local_1d8.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t
             .super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl;
        local_21c = iVar8;
LAB_00231afb:
        iVar8 = *_Var13._M_head_impl;
        local_210 = (long)__s[iVar8] * local_228;
        puVar18 = (uint *)(local_248.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start + local_210);
        if (0 < this->bytemap_range_) {
          lVar14 = 0;
          do {
            puVar18[lVar14 + 1] = 0x30;
            lVar14 = lVar14 + 1;
          } while (lVar14 < this->bytemap_range_);
        }
        *puVar18 = 0x30;
        local_200.size_ = 0;
        p_00->id = iVar8;
        bVar21 = false;
        p_00->cond = 0;
        local_230 = 1;
        local_218 = _Var13._M_head_impl;
LAB_00231b6a:
        local_230 = (ulong)((int)local_230 - 1);
        id = p_00[local_230].id;
        local_270 = p_00[local_230].cond;
LAB_00231b7e:
        lVar14 = (long)(int)id << 3;
        while( true ) {
          id = id + 1;
          pIVar2 = (this->inst_).ptr_._M_t.
                   super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                   _M_t.
                   super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                   .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
          uVar19 = *(uint *)((long)&pIVar2->out_opcode_ + lVar14);
          uVar7 = uVar19 & 7;
          if (uVar7 != 1) break;
          if ((uVar19 & 8) != 0) {
            __assert_fail("!ip->last()",
                          "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O3/_deps/re2-src/re2/onepass.cc"
                          ,0x1c5,"bool re2::Prog::IsOnePass()");
          }
          bVar4 = AddQ(&local_200,id);
          lVar14 = lVar14 + 8;
          if (!bVar4) goto LAB_00231f85;
        }
        uVar12 = (&switchD_00231bd1::switchdataD_00249d54)[uVar7];
        switch(uVar7) {
        case 0:
          LogMessage::LogMessage
                    (&local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O3/_deps/re2-src/re2/onepass.cc"
                     ,0x1bf);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&local_1b0.str_.super_basic_ostream<char,_std::char_traits<char>_>,
                     "unhandled opcode: ",0x12);
          std::ostream::operator<<
                    (&local_1b0.str_,*(uint *)((long)&pIVar2->out_opcode_ + lVar14) & 7);
          LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
        case 1:
          SparseSetT<void>::~SparseSetT(&local_200);
          SparseSetT<void>::~SparseSetT(&local_1d8);
          if (local_248.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_248.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_248.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_248.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (__s != (int *)0x0) {
            operator_delete(__s,__n);
          }
          if (p_00 != (InstCond *)0x0) {
            operator_delete(p_00,local_260 << 3);
          }
          _Unwind_Resume((long)&switchD_00231bd1::switchdataD_00249d54 + (long)(int)uVar12);
        case 2:
          this_00 = (Inst *)((long)&pIVar2->out_opcode_ + lVar14);
          iVar8 = __s[uVar19 >> 4];
          if (__s[uVar19 >> 4] == -1) {
            if ((int)local_208 <= iVar6) goto LAB_00231f85;
            AddQ(&local_1d8,uVar19 >> 4);
            __s[this_00->out_opcode_ >> 4] = iVar6;
            local_1b0.flushed_ = false;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_insert
                      (&local_248,
                       (iterator)
                       local_248.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish,local_228,&local_1b0.flushed_);
            puVar18 = (uint *)(local_248.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + local_210);
            uVar19 = this_00->out_opcode_;
            iVar8 = iVar6;
            iVar6 = iVar6 + 1;
          }
          if ((uVar19 & 7) != 2) {
LAB_00232078:
            __assert_fail("(opcode()) == (kInstByteRange)",
                          "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O3/_deps/re2-src/re2/prog.h"
                          ,0x57,"int re2::Prog::Inst::lo()");
          }
          uVar11 = (ulong)*(byte *)((long)&pIVar2->field_1 + lVar14);
          uVar12 = iVar8 << 0x10 | local_270;
          uVar7 = uVar12 | 0x40;
          if (!bVar21) {
            uVar7 = uVar12;
          }
          while (iVar8 = (int)uVar11,
                iVar8 <= (int)(uint)*(byte *)((long)&pIVar2->field_1 + lVar14 + 1)) {
            bVar5 = this->bytemap_[iVar8];
            uVar17 = (long)iVar8;
            do {
              if (uVar17 == 0xff) {
                uVar11 = 0x100;
                break;
              }
              uVar11 = uVar17 + 1;
              lVar10 = uVar17 + 1;
              uVar17 = uVar11;
            } while (this->bytemap_[lVar10] == bVar5);
            if ((~puVar18[(ulong)bVar5 + 1] & 0x30) == 0) {
              puVar18[(ulong)bVar5 + 1] = uVar7;
              uVar19 = this_00->out_opcode_;
            }
            else if (puVar18[(ulong)bVar5 + 1] != uVar7) goto LAB_00231f85;
            if ((uVar19 & 7) != 2) {
              __assert_fail("(opcode()) == (kInstByteRange)",
                            "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O3/_deps/re2-src/re2/prog.h"
                            ,0x58,"int re2::Prog::Inst::hi()");
            }
          }
          iVar8 = Inst::foldcase(this_00);
          uVar19 = this_00->out_opcode_;
          if (iVar8 != 0) {
            if ((uVar19 & 7) != 2) goto LAB_00232078;
            uVar12 = *(uint *)((long)&pIVar2->field_1 + lVar14);
            if ((byte)uVar12 < 0x62) {
              uVar12 = 0x61;
            }
            bVar5 = *(byte *)((long)&pIVar2->field_1 + lVar14 + 1);
            if (0x79 < bVar5) {
              bVar5 = 0x7a;
            }
            if ((byte)uVar12 <= bVar5) {
              iVar8 = (uVar12 & 0xff) - 0x20;
              do {
                bVar1 = this->bytemap_[iVar8];
                iVar20 = 0xff;
                if (0xff < iVar8) {
                  iVar20 = iVar8;
                }
                iVar15 = iVar8 + -1;
                lVar14 = (long)iVar8;
                do {
                  iVar16 = iVar20;
                  if (0xfe < lVar14) break;
                  iVar15 = iVar15 + 1;
                  lVar10 = lVar14 + 1;
                  lVar14 = lVar14 + 1;
                  iVar16 = iVar15;
                } while (this->bytemap_[lVar10] == bVar1);
                if ((~puVar18[(ulong)bVar1 + 1] & 0x30) == 0) {
                  puVar18[(ulong)bVar1 + 1] = uVar7;
                }
                else if (puVar18[(ulong)bVar1 + 1] != uVar7) goto LAB_00231f85;
                iVar8 = iVar16 + 1;
              } while (iVar16 < (int)(bVar5 - 0x20));
              uVar19 = this_00->out_opcode_;
            }
          }
          local_260 = __n_00;
          if ((uVar19 & 8) != 0) goto switchD_00231bd1_caseD_7;
          bVar4 = AddQ(&local_200,id);
          break;
        default:
          if ((uVar19 & 8) == 0) {
            bVar4 = AddQ(&local_200,id);
            if (!bVar4) goto LAB_00231f85;
            lVar10 = (long)(int)local_230;
            p_00[lVar10].id = id;
            local_230 = (ulong)((int)local_230 + 1);
            p_00[lVar10].cond = local_270;
            uVar19 = *(uint *)((long)&pIVar2->out_opcode_ + lVar14);
          }
          if ((uVar19 & 7) == 4) {
            local_270 = local_270 | *(uint *)((long)&pIVar2->field_1 + lVar14);
          }
          else if (((uVar19 & 7) == 3) &&
                  (iVar8 = *(int *)((long)&pIVar2->field_1 + lVar14), iVar8 < 10)) {
            local_270 = local_270 | 0x20 << ((byte)iVar8 & 0x1f);
          }
          bVar4 = AddQ(&local_200,uVar19 >> 4);
          if (bVar4) goto code_r0x00231dd0;
          goto LAB_00231f85;
        case 5:
          if (bVar21) goto LAB_00231f85;
          *puVar18 = local_270;
          if ((*(byte *)((long)&pIVar2->out_opcode_ + lVar14) & 8) != 0) goto LAB_00231ec0;
          bVar4 = AddQ(&local_200,id);
          bVar21 = true;
          break;
        case 7:
          goto switchD_00231bd1_caseD_7;
        }
        if (bVar4 == false) {
LAB_00231f85:
          bVar21 = false;
          goto LAB_00231f8f;
        }
        goto LAB_00231b7e;
      }
    }
    bVar21 = false;
  }
  return bVar21;
LAB_00231ec0:
  bVar21 = true;
switchD_00231bd1_caseD_7:
  if ((int)local_230 < 1) goto code_r0x00231edf;
  goto LAB_00231b6a;
code_r0x00231dd0:
  id = *(uint *)((long)&pIVar2->out_opcode_ + lVar14) >> 4;
  goto LAB_00231b7e;
code_r0x00231edf:
  _Var13._M_head_impl = local_218 + 1;
  iVar8 = local_21c;
  if (_Var13._M_head_impl ==
      local_1d8.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
      super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.super__Head_base<0UL,_int_*,_false>
      ._M_head_impl + local_1d8.size_) goto LAB_00231f1e;
  goto LAB_00231afb;
}

Assistant:

bool Prog::IsOnePass() {
  if (did_onepass_)
    return onepass_nodes_.data() != NULL;
  did_onepass_ = true;

  if (start() == 0)  // no match
    return false;

  // Steal memory for the one-pass NFA from the overall DFA budget.
  // Willing to use at most 1/4 of the DFA budget (heuristic).
  // Limit max node count to 65000 as a conservative estimate to
  // avoid overflowing 16-bit node index in encoding.
  int maxnodes = 2 + inst_count(kInstByteRange);
  int statesize = sizeof(OneState) + bytemap_range()*sizeof(uint32_t);
  if (maxnodes >= 65000 || dfa_mem_ / 4 / statesize < maxnodes)
    return false;

  // Flood the graph starting at the start state, and check
  // that in each reachable state, each possible byte leads
  // to a unique next state.
  int stacksize = inst_count(kInstCapture) +
                  inst_count(kInstEmptyWidth) +
                  inst_count(kInstNop) + 1;  // + 1 for start inst
  PODArray<InstCond> stack(stacksize);

  int size = this->size();
  PODArray<int> nodebyid(size);  // indexed by ip
  memset(nodebyid.data(), 0xFF, size*sizeof nodebyid[0]);

  // Originally, nodes was a uint8_t[maxnodes*statesize], but that was
  // unnecessarily optimistic: why allocate a large amount of memory
  // upfront for a large program when it is unlikely to be one-pass?
  std::vector<uint8_t> nodes;

  Instq tovisit(size), workq(size);
  AddQ(&tovisit, start());
  nodebyid[start()] = 0;
  int nalloc = 1;
  nodes.insert(nodes.end(), statesize, 0);
  for (Instq::iterator it = tovisit.begin(); it != tovisit.end(); ++it) {
    int id = *it;
    int nodeindex = nodebyid[id];
    OneState* node = IndexToNode(nodes.data(), statesize, nodeindex);

    // Flood graph using manual stack, filling in actions as found.
    // Default is none.
    for (int b = 0; b < bytemap_range_; b++)
      node->action[b] = kImpossible;
    node->matchcond = kImpossible;

    workq.clear();
    bool matched = false;
    int nstack = 0;
    stack[nstack].id = id;
    stack[nstack++].cond = 0;
    while (nstack > 0) {
      int id = stack[--nstack].id;
      uint32_t cond = stack[nstack].cond;

    Loop:
      Prog::Inst* ip = inst(id);
      switch (ip->opcode()) {
        default:
          LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
          break;

        case kInstAltMatch:
          // TODO(rsc): Ignoring kInstAltMatch optimization.
          // Should implement it in this engine, but it's subtle.
          DCHECK(!ip->last());
          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, id+1))
            goto fail;
          id = id+1;
          goto Loop;

        case kInstByteRange: {
          int nextindex = nodebyid[ip->out()];
          if (nextindex == -1) {
            if (nalloc >= maxnodes) {
              if (ExtraDebug)
                LOG(ERROR) << StringPrintf(
                    "Not OnePass: hit node limit %d >= %d", nalloc, maxnodes);
              goto fail;
            }
            nextindex = nalloc;
            AddQ(&tovisit, ip->out());
            nodebyid[ip->out()] = nalloc;
            nalloc++;
            nodes.insert(nodes.end(), statesize, 0);
            // Update node because it might have been invalidated.
            node = IndexToNode(nodes.data(), statesize, nodeindex);
          }
          for (int c = ip->lo(); c <= ip->hi(); c++) {
            int b = bytemap_[c];
            // Skip any bytes immediately after c that are also in b.
            while (c < 256-1 && bytemap_[c+1] == b)
              c++;
            uint32_t act = node->action[b];
            uint32_t newact = (nextindex << kIndexShift) | cond;
            if (matched)
              newact |= kMatchWins;
            if ((act & kImpossible) == kImpossible) {
              node->action[b] = newact;
            } else if (act != newact) {
              if (ExtraDebug)
                LOG(ERROR) << StringPrintf(
                    "Not OnePass: conflict on byte %#x at state %d", c, *it);
              goto fail;
            }
          }
          if (ip->foldcase()) {
            Rune lo = std::max<Rune>(ip->lo(), 'a') + 'A' - 'a';
            Rune hi = std::min<Rune>(ip->hi(), 'z') + 'A' - 'a';
            for (int c = lo; c <= hi; c++) {
              int b = bytemap_[c];
              // Skip any bytes immediately after c that are also in b.
              while (c < 256-1 && bytemap_[c+1] == b)
                c++;
              uint32_t act = node->action[b];
              uint32_t newact = (nextindex << kIndexShift) | cond;
              if (matched)
                newact |= kMatchWins;
              if ((act & kImpossible) == kImpossible) {
                node->action[b] = newact;
              } else if (act != newact) {
                if (ExtraDebug)
                  LOG(ERROR) << StringPrintf(
                      "Not OnePass: conflict on byte %#x at state %d", c, *it);
                goto fail;
              }
            }
          }

          if (ip->last())
            break;
          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, id+1))
            goto fail;
          id = id+1;
          goto Loop;
        }

        case kInstCapture:
        case kInstEmptyWidth:
        case kInstNop:
          if (!ip->last()) {
            // If already on work queue, (1) is violated: bail out.
            if (!AddQ(&workq, id+1))
              goto fail;
            stack[nstack].id = id+1;
            stack[nstack++].cond = cond;
          }

          if (ip->opcode() == kInstCapture && ip->cap() < kMaxCap)
            cond |= (1 << kCapShift) << ip->cap();
          if (ip->opcode() == kInstEmptyWidth)
            cond |= ip->empty();

          // kInstCapture and kInstNop always proceed to ip->out().
          // kInstEmptyWidth only sometimes proceeds to ip->out(),
          // but as a conservative approximation we assume it always does.
          // We could be a little more precise by looking at what c
          // is, but that seems like overkill.

          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, ip->out())) {
            if (ExtraDebug)
              LOG(ERROR) << StringPrintf(
                  "Not OnePass: multiple paths %d -> %d", *it, ip->out());
            goto fail;
          }
          id = ip->out();
          goto Loop;

        case kInstMatch:
          if (matched) {
            // (3) is violated
            if (ExtraDebug)
              LOG(ERROR) << StringPrintf(
                  "Not OnePass: multiple matches from %d", *it);
            goto fail;
          }
          matched = true;
          node->matchcond = cond;

          if (ip->last())
            break;
          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, id+1))
            goto fail;
          id = id+1;
          goto Loop;

        case kInstFail:
          break;
      }
    }
  }

  if (ExtraDebug) {  // For debugging, dump one-pass NFA to LOG(ERROR).
    LOG(ERROR) << "bytemap:\n" << DumpByteMap();
    LOG(ERROR) << "prog:\n" << Dump();

    std::map<int, int> idmap;
    for (int i = 0; i < size; i++)
      if (nodebyid[i] != -1)
        idmap[nodebyid[i]] = i;

    std::string dump;
    for (Instq::iterator it = tovisit.begin(); it != tovisit.end(); ++it) {
      int id = *it;
      int nodeindex = nodebyid[id];
      if (nodeindex == -1)
        continue;
      OneState* node = IndexToNode(nodes.data(), statesize, nodeindex);
      dump += StringPrintf("node %d id=%d: matchcond=%#x\n",
                           nodeindex, id, node->matchcond);
      for (int i = 0; i < bytemap_range_; i++) {
        if ((node->action[i] & kImpossible) == kImpossible)
          continue;
        dump += StringPrintf("  %d cond %#x -> %d id=%d\n",
                             i, node->action[i] & 0xFFFF,
                             node->action[i] >> kIndexShift,
                             idmap[node->action[i] >> kIndexShift]);
      }
    }
    LOG(ERROR) << "nodes:\n" << dump;
  }

  dfa_mem_ -= nalloc*statesize;
  onepass_nodes_ = PODArray<uint8_t>(nalloc*statesize);
  memmove(onepass_nodes_.data(), nodes.data(), nalloc*statesize);
  return true;

fail:
  return false;
}